

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_18a;
  byte local_189;
  LogMessage local_188;
  LogFinisher local_14a;
  byte local_149;
  LogMessage local_148;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  FileDescriptorProto *local_40;
  FileDescriptorProto *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear(&this->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear(&this->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Clear(&this->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear(&this->extension_);
  RepeatedField<int>::Clear(&this->public_dependency_);
  RepeatedField<int>::Clear(&this->weak_dependency_);
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 0x1f) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->name_,psVar2);
      local_79 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x56e);
        local_79 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_8d,pLVar3);
      }
      if ((local_79 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_78);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_package(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->package_,psVar2);
      local_c9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x572);
        local_c9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_c8,
                            "CHECK failed: !package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_ca,pLVar3);
      }
      if ((local_c9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_c8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->package_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_syntax(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->syntax_,psVar2);
      local_109 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x576);
        local_109 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_108,
                            "CHECK failed: !syntax_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_10a,pLVar3);
      }
      if ((local_109 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_108);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->syntax_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_options(this);
    if (bVar1) {
      local_149 = 0;
      if (this->options_ == (FileOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x57a);
        local_149 = 1;
        pLVar3 = internal::LogMessage::operator<<(&local_148,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_14a,pLVar3);
      }
      if ((local_149 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_148);
      }
      FileOptions::Clear(this->options_);
    }
    bVar1 = has_source_code_info(this);
    if (bVar1) {
      local_189 = 0;
      if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_188,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x57e);
        local_189 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_188,"CHECK failed: source_code_info_ != NULL: ");
        internal::LogFinisher::operator=(&local_18a,pLVar3);
      }
      if ((local_189 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_188);
      }
      SourceCodeInfo::Clear(this->source_code_info_);
    }
  }
  this_local = (FileDescriptorProto *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  if (_has_bits_[0 / 32] & 31u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_package()) {
      GOOGLE_DCHECK(!package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*package_.UnsafeRawStringPointer())->clear();
    }
    if (has_syntax()) {
      GOOGLE_DCHECK(!syntax_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*syntax_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::FileOptions::Clear();
    }
    if (has_source_code_info()) {
      GOOGLE_DCHECK(source_code_info_ != NULL);
      source_code_info_->::google::protobuf::SourceCodeInfo::Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}